

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m256i * convolve_12taps(__m256i *s,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i *in_RSI;
  undefined1 (*in_RDI) [32];
  __m256i res;
  __m256i res1;
  __m256i res_5;
  __m256i res_4;
  __m256i res_3;
  __m256i res_2;
  __m256i res_1;
  __m256i res_0;
  
  auVar1 = vpmaddwd_avx2(*in_RDI,(undefined1  [32])*in_RSI);
  auVar2 = vpmaddwd_avx2(in_RDI[1],(undefined1  [32])in_RSI[1]);
  auVar3 = vpmaddwd_avx2(in_RDI[2],(undefined1  [32])in_RSI[2]);
  auVar4 = vpmaddwd_avx2(in_RDI[3],(undefined1  [32])in_RSI[3]);
  auVar5 = vpmaddwd_avx2(in_RDI[4],(undefined1  [32])in_RSI[4]);
  auVar6 = vpmaddwd_avx2(in_RDI[5],(undefined1  [32])in_RSI[5]);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar4);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar2 = vpaddd_avx2(auVar5,auVar6);
  vpaddd_avx2(auVar2,auVar1);
  return in_RSI;
}

Assistant:

static inline __m256i convolve_12taps(const __m256i *const s,
                                      const __m256i *const coeffs) {
  const __m256i res_0 = _mm256_madd_epi16(s[0], coeffs[0]);
  const __m256i res_1 = _mm256_madd_epi16(s[1], coeffs[1]);
  const __m256i res_2 = _mm256_madd_epi16(s[2], coeffs[2]);
  const __m256i res_3 = _mm256_madd_epi16(s[3], coeffs[3]);
  const __m256i res_4 = _mm256_madd_epi16(s[4], coeffs[4]);
  const __m256i res_5 = _mm256_madd_epi16(s[5], coeffs[5]);

  const __m256i res1 = _mm256_add_epi32(_mm256_add_epi32(res_0, res_1),
                                        _mm256_add_epi32(res_2, res_3));
  const __m256i res = _mm256_add_epi32(_mm256_add_epi32(res_4, res_5), res1);

  return res;
}